

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::csharp::GetOutputFile
                   (string *__return_storage_ptr__,FileDescriptor *descriptor,string *file_extension
                   ,bool generate_directories,string *base_namespace,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  ulong *puVar6;
  size_type *psVar7;
  FileDescriptor *extraout_RDX;
  FileDescriptor *descriptor_00;
  string namespace_dir;
  string ns;
  string relative_filename;
  string namespace_suffix;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = error;
  GetFileNameBase_abi_cxx11_(&local_d8,(csharp *)descriptor,(FileDescriptor *)file_extension);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d8,(ulong)(file_extension->_M_dataplus)._M_p);
  paVar1 = &local_b8.field_2;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_b8.field_2._M_allocated_capacity = *puVar6;
    local_b8.field_2._8_8_ = plVar3[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar6;
    local_b8._M_dataplus._M_p = (pointer)*plVar3;
  }
  descriptor_00 = (FileDescriptor *)plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_b8._M_string_length = (size_type)descriptor_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    descriptor_00 = extraout_RDX;
  }
  if (!generate_directories) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_b8.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_b8.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity =
         local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    goto LAB_00213320;
  }
  GetFileNamespace_abi_cxx11_(&local_d8,(csharp *)descriptor,descriptor_00);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + local_d8._M_string_length);
  if (base_namespace->_M_string_length == 0) {
LAB_002131fd:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,".","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/","");
    StringReplace(&local_f8,&local_78,&local_118,&local_98,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_f8._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_f8);
    }
    std::operator+(__return_storage_ptr__,&local_f8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    paVar1 = &local_118.field_2;
    pcVar2 = (base_namespace->_M_dataplus)._M_p;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + base_namespace->_M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    lVar4 = std::__cxx11::string::find((char *)&local_f8,(ulong)local_118._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (lVar4 == 0) {
      std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      lVar5 = std::__cxx11::string::find((char *)&local_78,0x360593,0);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_78);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      std::operator+(&local_50,"Namespace ",&local_d8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98.field_2._8_8_ = plVar3[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_98._M_string_length = plVar3[1];
      *plVar3 = (long)psVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)(base_namespace->_M_dataplus)._M_p);
      psVar7 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_118.field_2._M_allocated_capacity = *psVar7;
        local_118.field_2._8_8_ = plVar3[3];
        local_118._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar7;
        local_118._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_118._M_string_length = plVar3[1];
      *plVar3 = (long)psVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (lVar4 == 0) goto LAB_002131fd;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
LAB_00213320:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOutputFile(
    const google::protobuf::FileDescriptor* descriptor,
    const std::string file_extension,
    const bool generate_directories,
    const std::string base_namespace,
    string* error) {
  string relative_filename = GetFileNameBase(descriptor) + file_extension;
  if (!generate_directories) {
    return relative_filename;
  }
  string ns = GetFileNamespace(descriptor);
  string namespace_suffix = ns;
  if (!base_namespace.empty()) {
    // Check that the base_namespace is either equal to or a leading part of
    // the file namespace. This isn't just a simple prefix; "Foo.B" shouldn't
    // be regarded as a prefix of "Foo.Bar". The simplest option is to add "."
    // to both.
    string extended_ns = ns + ".";
    if (extended_ns.find(base_namespace + ".") != 0) {
      *error = "Namespace " + ns + " is not a prefix namespace of base namespace " + base_namespace;
      return ""; // This will be ignored, because we've set an error.
    }
    namespace_suffix = ns.substr(base_namespace.length());
    if (namespace_suffix.find(".") == 0) {
      namespace_suffix = namespace_suffix.substr(1);
    }
  }

  string namespace_dir = StringReplace(namespace_suffix, ".", "/", true);
  if (!namespace_dir.empty()) {
    namespace_dir += "/";
  }
  return namespace_dir + relative_filename;
}